

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O2

void __thiscall
indk::Neuron::doCreateNewSynapseCluster
          (Neuron *this,vector<float,_std::allocator<float>_> *PosVector,uint R,float k1,int64_t Tl,
          int NT)

{
  undefined8 uVar1;
  pointer ppVar2;
  long lVar3;
  pointer EName;
  double dVar4;
  undefined1 auVar5 [16];
  initializer_list<float> __l;
  allocator_type local_9d;
  float local_9c;
  float local_98;
  float local_94;
  double local_90;
  undefined8 local_88;
  undefined4 local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  EName = (this->Entries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = ((long)ppVar2 - (long)EName) / 0x28;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  local_9c = (float)(360.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
  local_68 = (double)R;
  uVar1 = *(undefined8 *)
           (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (double)(float)uVar1;
  dStack_70 = (double)(float)((ulong)uVar1 >> 0x20);
  local_94 = 0.0;
  local_98 = k1;
  dStack_60 = local_68;
  for (; EName != ppVar2; EName = EName + 1) {
    local_90 = (double)(local_94 / 180.0) * 3.141592653589793;
    local_58 = cos(local_90);
    dVar4 = sin(local_90);
    local_88 = CONCAT44((float)(dVar4 * dStack_60 + dStack_70),
                        (float)(local_58 * local_68 + local_78));
    local_80 = 0;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_88;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_48,__l,&local_9d);
    doCreateNewSynapse(this,&EName->first,(vector<float,_std::allocator<float>_> *)&local_48,
                       local_98,Tl,NT);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
    local_94 = local_94 + local_9c;
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapseCluster(const std::vector<float>& PosVector, unsigned R, float k1, int64_t Tl, int NT) {
    float x = PosVector[0];
    float y = PosVector[1];

    float dfi = 360. / Entries.size();
    float fi = 0;
    float xr, yr;
    for (auto &ne: Entries) {
        xr = x + R * cos(fi/180*M_PI);
        yr = y + R * sin(fi/180*M_PI);
        doCreateNewSynapse(ne.first, {xr, yr, 0}, k1, Tl, NT);
        fi += dfi;
    }
}